

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

LoopEntryPointInfo * __thiscall
Js::FunctionBody::GetLoopEntryPointInfoFromNativeAddress
          (FunctionBody *this,DWORD_PTR codeAddress,uint loopNum)

{
  SynchronizableList<Js::LoopEntryPointInfo_*,_JsUtil::List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar1;
  LoopEntryPointInfo *this_00;
  code *pcVar2;
  bool bVar3;
  LoopHeader *pLVar4;
  undefined4 *puVar5;
  DWORD_PTR DVar6;
  ptrdiff_t pVar7;
  int i;
  long lVar8;
  LoopEntryPointInfo *pLVar9;
  
  pLVar4 = GetLoopHeader(this,loopNum);
  if (pLVar4 == (LoopHeader *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0xd26,"(loopHeader)","loopHeader");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pSVar1 = (pLVar4->entryPoints).ptr;
  pLVar9 = (LoopEntryPointInfo *)0x0;
  if (pSVar1 != (SynchronizableList<Js::LoopEntryPointInfo_*,_JsUtil::List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                 *)0x0) {
    for (lVar8 = 0;
        lVar8 < (pSVar1->
                super_List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ).super_ReadOnlyList<Js::LoopEntryPointInfo_*,_Memory::Recycler,_DefaultComparer>.
                count; lVar8 = lVar8 + 1) {
      this_00 = (pSVar1->
                super_List<Js::LoopEntryPointInfo_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                ).super_ReadOnlyList<Js::LoopEntryPointInfo_*,_Memory::Recycler,_DefaultComparer>.
                buffer.ptr[lVar8].ptr;
      if (this_00 != (LoopEntryPointInfo *)0x0) {
        bVar3 = EntryPointInfo::IsCodeGenDone(&this_00->super_EntryPointInfo);
        if (bVar3) {
          DVar6 = EntryPointInfo::GetNativeAddress(&this_00->super_EntryPointInfo);
          if (DVar6 <= codeAddress) {
            DVar6 = EntryPointInfo::GetNativeAddress(&this_00->super_EntryPointInfo);
            pVar7 = EntryPointInfo::GetCodeSize(&this_00->super_EntryPointInfo);
            if (codeAddress < pVar7 + DVar6) {
              pLVar9 = this_00;
            }
          }
        }
      }
    }
  }
  return pLVar9;
}

Assistant:

LoopEntryPointInfo * FunctionBody::GetLoopEntryPointInfoFromNativeAddress(DWORD_PTR codeAddress, uint loopNum) const
    {
        LoopEntryPointInfo * entryPoint = nullptr;

        LoopHeader * loopHeader = this->GetLoopHeader(loopNum);
        Assert(loopHeader);

        loopHeader->MapEntryPoints([&](int index, LoopEntryPointInfo * currentEntryPoint)
        {
            if (currentEntryPoint->IsCodeGenDone() &&
                codeAddress >= currentEntryPoint->GetNativeAddress() &&
                codeAddress < currentEntryPoint->GetNativeAddress() + currentEntryPoint->GetCodeSize())
            {
                entryPoint = currentEntryPoint;
            }
        });

        return entryPoint;
    }